

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O1

void __thiscall
glslang::TParseVersions::requireNotRemoved
          (TParseVersions *this,TSourceLoc *loc,int profileMask,int removedVersion,char *featureDesc
          )

{
  uint uVar1;
  char *pcVar2;
  char buf [60];
  char acStack_68 [72];
  
  if ((this->profile & profileMask) != EBadProfile) {
    if (removedVersion <= this->version) {
      uVar1 = this->profile - ENoProfile;
      if (uVar1 < 8) {
        pcVar2 = *(char **)(&DAT_0093b8d0 + (ulong)uVar1 * 8);
      }
      else {
        pcVar2 = "unknown profile";
      }
      snprintf(acStack_68,0x3c,"%s profile; removed in version %d",pcVar2,
               (ulong)(uint)removedVersion);
      (*this->_vptr_TParseVersions[0x2d])(this,loc,"no longer supported in",featureDesc,acStack_68);
    }
  }
  return;
}

Assistant:

void TParseVersions::requireNotRemoved(const TSourceLoc& loc, int profileMask, int removedVersion, const char* featureDesc)
{
    if (profile & profileMask) {
        if (version >= removedVersion) {
            const int maxSize = 60;
            char buf[maxSize];
            snprintf(buf, maxSize, "%s profile; removed in version %d", ProfileName(profile), removedVersion);
            error(loc, "no longer supported in", featureDesc, buf);
        }
    }
}